

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O0

bool __thiscall
QWidgetTextControlPrivate::dragMoveEvent
          (QWidgetTextControlPrivate *this,QEvent *e,QMimeData *mimeData,QPointF *pos)

{
  bool bVar1;
  MoveMode MVar2;
  QWidgetTextControl *pQVar3;
  QTextCursor *in_RCX;
  QWidgetTextControl *in_RDX;
  QEvent *in_RSI;
  QWidgetTextControlPrivate *in_RDI;
  long in_FS_OFFSET;
  int cursorPos;
  QWidgetTextControl *q;
  QRectF crect;
  undefined4 in_stack_ffffffffffffff68;
  TextInteractionFlag in_stack_ffffffffffffff6c;
  byte local_85;
  bool local_51;
  QRectF local_30;
  QFlagsStorageHelper<Qt::TextInteractionFlag,_4> local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = q_func(in_RDI);
  local_c.super_QFlagsStorage<Qt::TextInteractionFlag>.i =
       (QFlagsStorage<Qt::TextInteractionFlag>)
       QFlags<Qt::TextInteractionFlag>::operator&
                 ((QFlags<Qt::TextInteractionFlag> *)in_RDI,in_stack_ffffffffffffff6c);
  bVar1 = QFlags<Qt::TextInteractionFlag>::operator!((QFlags<Qt::TextInteractionFlag> *)&local_c);
  local_85 = 1;
  if (!bVar1) {
    local_85 = (**(code **)(*(long *)pQVar3 + 0xa0))(pQVar3,in_RDX);
    local_85 = local_85 ^ 0xff;
  }
  if ((local_85 & 1) == 0) {
    MVar2 = (**(code **)(*(long *)pQVar3 + 0x78))(pQVar3,in_RCX,1);
    if (MVar2 != ~MoveAnchor) {
      local_30.xp = -NAN;
      local_30.yp = -NAN;
      local_30.w = -NAN;
      local_30.h = -NAN;
      QWidgetTextControl::cursorRect(in_RDX,in_RCX);
      bVar1 = QRectF::isValid(&local_30);
      if (bVar1) {
        QWidgetTextControl::updateRequest
                  ((QWidgetTextControl *)in_RDI,
                   (QRectF *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
      }
      QTextCursor::operator=(&in_RDI->dndFeedbackCursor,&in_RDI->cursor);
      QTextCursor::setPosition((int)in_RDI + 0xa8,MVar2);
      QWidgetTextControl::cursorRect(in_RDX,in_RCX);
      QWidgetTextControl::updateRequest
                ((QWidgetTextControl *)in_RDI,
                 (QRectF *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    }
    local_51 = true;
  }
  else {
    QEvent::ignore(in_RSI);
    local_51 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_51;
}

Assistant:

bool QWidgetTextControlPrivate::dragMoveEvent(QEvent *e, const QMimeData *mimeData, const QPointF &pos)
{
    Q_Q(QWidgetTextControl);
    if (!(interactionFlags & Qt::TextEditable) || !q->canInsertFromMimeData(mimeData)) {
        e->ignore();
        return false;
    }

    const int cursorPos = q->hitTest(pos, Qt::FuzzyHit);
    if (cursorPos != -1) {
        QRectF crect = q->cursorRect(dndFeedbackCursor);
        if (crect.isValid())
            emit q->updateRequest(crect);

        dndFeedbackCursor = cursor;
        dndFeedbackCursor.setPosition(cursorPos);

        crect = q->cursorRect(dndFeedbackCursor);
        emit q->updateRequest(crect);
    }

    return true; // accept proposed action
}